

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls_scache.c
# Opt level: O0

CURLcode Curl_ssl_scache_create
                   (size_t max_peers,size_t max_sessions_per_peer,Curl_ssl_scache **pscache)

{
  Curl_ssl_scache_peer *pCVar1;
  Curl_ssl_scache *pCVar2;
  ulong local_40;
  size_t i;
  Curl_ssl_scache_peer *peers;
  Curl_ssl_scache *scache;
  Curl_ssl_scache **pscache_local;
  size_t max_sessions_per_peer_local;
  size_t max_peers_local;
  
  *pscache = (Curl_ssl_scache *)0x0;
  pCVar1 = (Curl_ssl_scache_peer *)(*Curl_ccalloc)(max_peers,0xa8);
  if (pCVar1 == (Curl_ssl_scache_peer *)0x0) {
    max_peers_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    pCVar2 = (Curl_ssl_scache *)(*Curl_ccalloc)(1,0x28);
    if (pCVar2 == (Curl_ssl_scache *)0x0) {
      (*Curl_cfree)(pCVar1);
      max_peers_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      pCVar2->magic = 0xe1551;
      pCVar2->default_lifetime_secs = 0x15180;
      pCVar2->peer_count = max_peers;
      pCVar2->peers = pCVar1;
      pCVar2->age = 1;
      for (local_40 = 0; local_40 < pCVar2->peer_count; local_40 = local_40 + 1) {
        pCVar2->peers[local_40].max_sessions = max_sessions_per_peer;
        Curl_llist_init(&pCVar2->peers[local_40].sessions,cf_ssl_scache_sesssion_ldestroy);
      }
      *pscache = pCVar2;
      max_peers_local._4_4_ = CURLE_OK;
    }
  }
  return max_peers_local._4_4_;
}

Assistant:

CURLcode Curl_ssl_scache_create(size_t max_peers,
                                size_t max_sessions_per_peer,
                                struct Curl_ssl_scache **pscache)
{
  struct Curl_ssl_scache *scache;
  struct Curl_ssl_scache_peer *peers;
  size_t i;

  *pscache = NULL;
  peers = calloc(max_peers, sizeof(*peers));
  if(!peers)
    return CURLE_OUT_OF_MEMORY;

  scache = calloc(1, sizeof(*scache));
  if(!scache) {
    free(peers);
    return CURLE_OUT_OF_MEMORY;
  }

  scache->magic = CURL_SCACHE_MAGIC;
  scache->default_lifetime_secs = (24*60*60); /* 1 day */
  scache->peer_count = max_peers;
  scache->peers = peers;
  scache->age = 1;
  for(i = 0; i < scache->peer_count; ++i) {
    scache->peers[i].max_sessions = max_sessions_per_peer;
    Curl_llist_init(&scache->peers[i].sessions,
                    cf_ssl_scache_sesssion_ldestroy);
  }

  *pscache = scache;
  return CURLE_OK;
}